

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxOutIndexWithOffsetByHandle
              (void *handle,void *tx_data_handle,uint32_t offset,char *address,
              char *direct_locking_script,uint32_t *index)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 uVar3;
  char *in_RCX;
  uint in_EDX;
  ConfidentialTransactionContext *in_RSI;
  uint32_t *in_R8;
  uint *in_R9;
  CfdException *except;
  exception *std_except;
  uint *work_index;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  uint32_t temp_index;
  Address addr_1;
  string addr_str;
  ElementsAddressFactory address_factory;
  ConfidentialTransactionContext *tx_1;
  Address addr;
  TransactionContext *tx;
  bool is_bitcoin;
  bool is_find;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  CfdCapiTransactionData *tx_data;
  ElementsConfidentialAddress *in_stack_fffffffffffff4f0;
  AddressFactory *in_stack_fffffffffffff4f8;
  string *in_stack_fffffffffffff500;
  string *message;
  ElementsAddressFactory *in_stack_fffffffffffff508;
  CfdError CVar4;
  CfdException *in_stack_fffffffffffff510;
  CfdException *this;
  ElementsAddressFactory *in_stack_fffffffffffff520;
  bool *in_stack_fffffffffffff548;
  allocator *paVar5;
  int in_stack_fffffffffffff554;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff560;
  undefined7 in_stack_fffffffffffff568;
  undefined1 in_stack_fffffffffffff56f;
  Address *in_stack_fffffffffffff570;
  pointer indexes_00;
  ConfidentialTransactionContext *in_stack_fffffffffffff578;
  Script *in_stack_fffffffffffff580;
  Script *locking_script;
  undefined7 in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff58f;
  uint32_t *in_stack_fffffffffffff598;
  ConfidentialTransactionContext *this_00;
  undefined1 local_a39 [33];
  char *local_a18;
  int local_a10;
  string *in_stack_fffffffffffff5f8;
  undefined6 in_stack_fffffffffffff600;
  undefined1 in_stack_fffffffffffff606;
  exception in_stack_fffffffffffff607;
  string local_9f8 [32];
  CfdSourceLocation local_9d8;
  reference local_9c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_9b8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_9b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_9a8;
  uint local_99c;
  Address local_998;
  ElementsConfidentialAddress local_820;
  Address local_670;
  Address local_4f8;
  allocator local_379;
  string local_378 [2];
  allocator local_329;
  string local_328;
  Script local_308;
  pointer local_2d0;
  allocator local_2c1;
  string local_2c0;
  Address local_2a0;
  Script local_121;
  pointer local_c8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [38];
  byte local_92;
  byte local_91;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  ConfidentialTransactionContext *local_78;
  allocator local_69;
  string local_68 [48];
  uint *local_38;
  uint32_t *local_30;
  char *local_28;
  uint local_1c;
  ConfidentialTransactionContext *local_18;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"TransactionData",&local_69);
  cfd::capi::CheckBuffer
            ((void *)CONCAT17(in_stack_fffffffffffff607,
                              CONCAT16(in_stack_fffffffffffff606,in_stack_fffffffffffff600)),
             in_stack_fffffffffffff5f8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x62d40e);
  local_91 = 0;
  local_92 = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffff554,in_stack_fffffffffffff548);
  if ((local_78->super_ConfidentialTransaction).vin_.
      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
      _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    local_ba = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    CVar4 = (CfdError)((ulong)in_stack_fffffffffffff508 >> 0x20);
    paVar5 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Invalid handle state. tx is null",paVar5);
    cfd::core::CfdException::CfdException(in_stack_fffffffffffff510,CVar4,in_stack_fffffffffffff500)
    ;
    local_ba = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_92 & 1) == 0) {
    local_2d0 = (local_78->super_ConfidentialTransaction).vin_.
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = cfd::capi::IsEmptyString((char *)local_30);
    if (bVar2) {
      bVar2 = cfd::capi::IsEmptyString(local_28);
      if (bVar2) {
        local_99c = 0;
        local_91 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut
                             (this_00,in_stack_fffffffffffff598);
        if ((bool)local_91) {
          if (local_99c < local_1c) {
            local_91 = 0;
          }
          else if (local_38 != (uint *)0x0) {
            *local_38 = local_99c;
          }
        }
      }
      else {
        cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff520);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_378,local_28,&local_379);
        std::allocator<char>::~allocator((allocator<char> *)&local_379);
        cfd::core::Address::Address(&local_4f8);
        bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_378);
        if (bVar2) {
          cfd::ElementsAddressFactory::GetConfidentialAddress
                    (in_stack_fffffffffffff508,in_stack_fffffffffffff500);
          cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&local_670,&local_820);
          cfd::core::Address::operator=(&local_4f8,&local_670);
          cfd::core::Address::~Address(&in_stack_fffffffffffff4f0->unblinded_address_);
          cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                    (in_stack_fffffffffffff4f0);
        }
        else {
          cfd::AddressFactory::GetAddress
                    (in_stack_fffffffffffff4f8,(string *)in_stack_fffffffffffff4f0);
          cfd::core::Address::operator=(&local_4f8,&local_998);
          cfd::core::Address::~Address(&in_stack_fffffffffffff4f0->unblinded_address_);
        }
        cfd::ConfidentialTransactionContext::IsFindTxOut
                  (in_stack_fffffffffffff578,in_stack_fffffffffffff570,
                   (uint32_t *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568),
                   in_stack_fffffffffffff560);
        cfd::core::Address::~Address(&in_stack_fffffffffffff4f0->unblinded_address_);
        std::__cxx11::string::~string((string *)local_378);
        cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x62dc1e);
      }
    }
    else {
      paVar5 = &local_329;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_328,(char *)local_30,paVar5);
      cfd::core::Script::Script(&local_308,&local_328);
      cfd::ConfidentialTransactionContext::IsFindTxOut
                ((ConfidentialTransactionContext *)
                 CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                 in_stack_fffffffffffff580,(uint32_t *)in_stack_fffffffffffff578,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff570);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff4f0);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
    }
  }
  else {
    local_c8 = (local_78->super_ConfidentialTransaction).vin_.
               super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar1 = cfd::capi::IsEmptyString((char *)local_30);
    if ((bool)uVar1) {
      uVar1 = cfd::capi::IsEmptyString(local_28);
      if (!(bool)uVar1) {
        paVar5 = &local_2c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2c0,local_28,paVar5);
        cfd::core::Address::Address(&local_2a0,&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        cfd::TransactionContext::IsFindTxOut
                  ((TransactionContext *)in_stack_fffffffffffff578,in_stack_fffffffffffff570,
                   (uint32_t *)CONCAT17(uVar1,in_stack_fffffffffffff568),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar5);
        cfd::core::Address::~Address(&in_stack_fffffffffffff4f0->unblinded_address_);
      }
    }
    else {
      locking_script = &local_121;
      indexes_00 = local_c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)&local_121._vptr_Script + 1),(char *)local_30,
                 (allocator *)locking_script);
      cfd::core::Script::Script
                ((Script *)
                 ((long)&local_121.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1),
                 (string *)((long)&local_121._vptr_Script + 1));
      cfd::TransactionContext::IsFindTxOut
                ((TransactionContext *)CONCAT17(uVar1,in_stack_fffffffffffff588),locking_script,
                 local_30,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)indexes_00);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff4f0);
      std::__cxx11::string::~string((string *)((long)&local_121._vptr_Script + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
  }
  CVar4 = (CfdError)((ulong)in_stack_fffffffffffff508 >> 0x20);
  if ((local_91 & 1) == 0) {
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&local_90);
    CVar4 = (CfdError)((ulong)in_stack_fffffffffffff508 >> 0x20);
    if (!bVar2) {
      local_9a8 = &local_90;
      local_9b0._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(local_9a8);
      local_9b8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(local_9a8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&local_9b0,&local_9b8);
        CVar4 = (CfdError)((ulong)in_stack_fffffffffffff508 >> 0x20);
        if (!bVar2) break;
        local_9c0 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&local_9b0);
        CVar4 = (CfdError)((ulong)in_stack_fffffffffffff508 >> 0x20);
        if (local_1c <= *local_9c0) {
          local_91 = 1;
          if (local_38 != (uint *)0x0) {
            *local_38 = *local_9c0;
          }
          break;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_9b0);
      }
    }
  }
  if ((local_91 & 1) != 0) {
    local_4 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff500);
    return local_4;
  }
  if (local_38 != (uint *)0x0) {
    *local_38 = 0;
  }
  if (local_1c != 0) {
    local_a18 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                        ,0x2f);
    local_a18 = local_a18 + 1;
    local_a10 = 0x1021;
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_a18,"target not found by offset.");
    uVar3 = __cxa_allocate_exception(0x30);
    message = (string *)local_a39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a39 + 1),"There are no targets after the offset.",
               (allocator *)message);
    cfd::core::CfdException::CfdException(in_stack_fffffffffffff510,CVar4,message);
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_9d8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_9d8.filename = local_9d8.filename + 1;
  local_9d8.line = 0x101c;
  local_9d8.funcname = "CfdGetTxOutIndexWithOffsetByHandle";
  cfd::core::logger::warn<>(&local_9d8,"target not found.");
  uVar3 = __cxa_allocate_exception(0x30);
  this = (CfdException *)&stack0xfffffffffffff607;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9f8,"Failed to parameter. search target is not found.",(allocator *)this);
  cfd::core::CfdException::CfdException
            (this,(CfdError)((ulong)uVar3 >> 0x20),in_stack_fffffffffffff500);
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxOutIndexWithOffsetByHandle(
    void* handle, void* tx_data_handle, uint32_t offset, const char* address,
    const char* direct_locking_script, uint32_t* index) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    std::vector<uint32_t> indexes;
    bool is_find = false;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(direct_locking_script)) {
        tx->IsFindTxOut(Script(direct_locking_script), index, &indexes);
      } else if (!IsEmptyString(address)) {
        Address addr(address);
        tx->IsFindTxOut(addr, index, &indexes);
      } else {
        // do nothing
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (!IsEmptyString(direct_locking_script)) {
        tx->IsFindTxOut(Script(direct_locking_script), index, &indexes);
      } else if (!IsEmptyString(address)) {
        ElementsAddressFactory address_factory;
        std::string addr_str(address);
        Address addr;
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr_str)) {
          addr = address_factory.GetConfidentialAddress(addr_str)
                     .GetUnblindedAddress();
        } else {
          addr = address_factory.GetAddress(addr_str);
        }
        tx->IsFindTxOut(addr, index, &indexes);
      } else {
        // fee
        uint32_t temp_index = 0;
        is_find = tx->IsFindFeeTxOut(&temp_index);
        if (is_find) {
          if (offset > temp_index)
            is_find = false;
          else if (index != nullptr)
            *index = temp_index;
        }
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if ((!is_find) && (!indexes.empty())) {
      for (const auto& work_index : indexes) {
        if (offset <= work_index) {
          is_find = true;
          if (index != nullptr) *index = work_index;
          break;
        }
      }
    }

    if (!is_find) {
      if (index != nullptr) *index = 0;
      if (offset == 0) {
        warn(CFD_LOG_SOURCE, "target not found.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. search target is not found.");
      } else {
        warn(CFD_LOG_SOURCE, "target not found by offset.");
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "There are no targets after the offset.");
      }
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}